

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

bool __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse_set_delimiter_tag
          (parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *contents,
          delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *delimiter_set)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> begin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> contents_substr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> end;
  
  if ((4 < contents->_M_string_length) &&
     ((contents->_M_dataplus)._M_p[contents->_M_string_length - 1] == '=')) {
    std::__cxx11::string::substr((ulong)&begin,(ulong)contents);
    trim<std::__cxx11::string>(&contents_substr,(mustache *)&begin,s);
    std::__cxx11::string::~string((string *)&begin);
    bVar1 = false;
    lVar2 = std::__cxx11::string::find((char)&contents_substr,0x20);
    if (lVar2 != -1) {
      lVar2 = std::__cxx11::string::find_first_not_of((char)&contents_substr,0x20);
      if (lVar2 == -1) {
        __assert_fail("nonspace != string_type::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp"
                      ,0x33c,
                      "bool kainjow::mustache::parser<std::basic_string<char>>::parse_set_delimiter_tag(const string_type &, delimiter_set<string_type> &) const [string_type = std::basic_string<char>]"
                     );
      }
      std::__cxx11::string::substr((ulong)&begin,(ulong)&contents_substr);
      std::__cxx11::string::substr((ulong)&end,(ulong)&contents_substr);
      bVar1 = is_set_delimiter_valid(this,&begin);
      if ((bVar1) && (bVar1 = is_set_delimiter_valid(this,&end), bVar1)) {
        std::__cxx11::string::_M_assign((string *)delimiter_set);
        bVar1 = true;
        std::__cxx11::string::_M_assign((string *)&delimiter_set->end);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&end);
      std::__cxx11::string::~string((string *)&begin);
    }
    std::__cxx11::string::~string((string *)&contents_substr);
    return bVar1;
  }
  return false;
}

Assistant:

stream_type& render(basic_context<string_type>& ctx, stream_type& stream) {
        context_internal<string_type> context{ctx};
        render([&stream](const string_type& str) {
            stream << str;
        }, context);
        return stream;
    }